

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

MarbleTexture *
pbrt::MarbleTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  MarbleTexture *pMVar1;
  undefined8 in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  Float FVar2;
  Float FVar3;
  TextureMapping3D map;
  string *in_stack_fffffffffffffea8;
  TextureParameterDictionary *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  allocator<char> *args_2;
  undefined4 in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  allocator<char> *in_stack_fffffffffffffee0;
  allocator<char> *__a;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_e1;
  string local_e0 [16];
  FileLoc *in_stack_ffffffffffffff30;
  Transform *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  Allocator in_stack_ffffffffffffff48;
  allocator<char> local_91;
  string local_90 [32];
  Float local_70;
  allocator<char> local_59;
  string local_58 [36];
  int local_34;
  undefined8 local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  undefined8 local_8;
  
  local_18 = in_RSI;
  local_8 = in_RCX;
  TextureParameterDictionary::operator_cast_to_ParameterDictionary_
            ((TextureParameterDictionary *)in_RSI);
  local_30 = local_8;
  TextureMapping3D::Create
            ((ParameterDictionary *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffef0,
             (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             in_stack_fffffffffffffee0);
  local_34 = TextureParameterDictionary::GetOneInt
                       (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0);
  this = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             in_stack_fffffffffffffee0);
  FVar2 = TextureParameterDictionary::GetOneFloat
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0.0);
  __a = (allocator<char> *)&stack0xffffffffffffff47;
  args = local_18;
  local_70 = FVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)CONCAT44(FVar2,in_stack_fffffffffffffee8),__a);
  FVar3 = TextureParameterDictionary::GetOneFloat
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0.0);
  args_2 = &local_e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)CONCAT44(FVar2,in_stack_fffffffffffffee8),__a);
  FVar2 = TextureParameterDictionary::GetOneFloat
                    (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0.0);
  pMVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::MarbleTexture,pbrt::TextureMapping3D&,int,float,float,float>
                     ((polymorphic_allocator<std::byte> *)__a,(TextureMapping3D *)args,
                      (int *)CONCAT44(FVar3,in_stack_fffffffffffffed0),(float *)args_2,
                      (float *)local_18,(float *)CONCAT44(FVar2,in_stack_fffffffffffffeb8));
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  return pMVar1;
}

Assistant:

MarbleTexture *MarbleTexture::Create(const Transform &renderFromTexture,
                                     const TextureParameterDictionary &parameters,
                                     const FileLoc *loc, Allocator alloc) {
    // Initialize 3D texture mapping _map_ from _tp_
    TextureMapping3D map =
        TextureMapping3D::Create(parameters, renderFromTexture, loc, alloc);
    return alloc.new_object<MarbleTexture>(
        map, parameters.GetOneInt("octaves", 8), parameters.GetOneFloat("roughness", .5f),
        parameters.GetOneFloat("scale", 1.f), parameters.GetOneFloat("variation", .2f));
}